

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint update_adler32(uint adler,uchar *data,uint len)

{
  uint local_30;
  uint local_28;
  uint amount;
  uint i;
  uint s2;
  uint s1;
  uint len_local;
  uchar *data_local;
  uint adler_local;
  
  i = adler & 0xffff;
  amount = adler >> 0x10;
  s2 = len;
  _s1 = data;
  while (s2 != 0) {
    if (s2 < 0x15b1) {
      local_30 = s2;
    }
    else {
      local_30 = 0x15b0;
    }
    s2 = s2 - local_30;
    for (local_28 = 0; local_28 != local_30; local_28 = local_28 + 1) {
      i = *_s1 + i;
      amount = i + amount;
      _s1 = _s1 + 1;
    }
    i = i % 0xfff1;
    amount = amount % 0xfff1;
  }
  return amount << 0x10 | i;
}

Assistant:

static unsigned update_adler32(unsigned adler, const unsigned char* data, unsigned len) {
  unsigned s1 = adler & 0xffffu;
  unsigned s2 = (adler >> 16u) & 0xffffu;

  while(len != 0u) {
    unsigned i;
    /*at least 5552 sums can be done before the sums overflow, saving a lot of module divisions*/
    unsigned amount = len > 5552u ? 5552u : len;
    len -= amount;
    for(i = 0; i != amount; ++i) {
      s1 += (*data++);
      s2 += s1;
    }
    s1 %= 65521u;
    s2 %= 65521u;
  }

  return (s2 << 16u) | s1;
}